

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::refreshSystemChanAssign(Synth *this,Bit8u firstPart,Bit8u lastPart)

{
  byte bVar1;
  uint local_2c;
  Bit32u j;
  Bit8u *chanParts;
  uint local_18;
  Bit8u chan;
  Bit32u i;
  Bit8u lastPart_local;
  Bit8u firstPart_local;
  Synth *this_local;
  
  memset(this->extensions->chantable,0xff,0x90);
  local_18 = 0;
  do {
    if (8 < local_18) {
      return;
    }
    if (((this->parts[local_18] != (Part *)0x0) && (firstPart <= local_18)) &&
       (local_18 <= lastPart)) {
      Part::allSoundOff(this->parts[local_18]);
      Part::resetAllControllers(this->parts[local_18]);
    }
    bVar1 = (this->mt32ram->system).chanAssign[local_18];
    if (bVar1 < 0x10) {
      for (local_2c = 0; local_2c < 9; local_2c = local_2c + 1) {
        if (8 < this->extensions->chantable[bVar1][local_2c]) {
          this->extensions->chantable[bVar1][local_2c] = (Bit8u)local_18;
          break;
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void Synth::refreshSystemChanAssign(Bit8u firstPart, Bit8u lastPart) {
	memset(extensions.chantable, 0xFF, sizeof(extensions.chantable));

	// CONFIRMED: In the case of assigning a MIDI channel to multiple parts,
	//            the messages received on that MIDI channel are handled by all the parts.
	for (Bit32u i = 0; i <= 8; i++) {
		if (parts[i] != NULL && i >= firstPart && i <= lastPart) {
			// CONFIRMED: Decay is started for all polys, and all controllers are reset, for every part whose assignment was touched by the sysex write.
			parts[i]->allSoundOff();
			parts[i]->resetAllControllers();
		}
		Bit8u chan = mt32ram.system.chanAssign[i];
		if (chan > 15) continue;
		Bit8u *chanParts = extensions.chantable[chan];
		for (Bit32u j = 0; j <= 8; j++) {
			if (chanParts[j] > 8) {
				chanParts[j] = Bit8u(i);
				break;
			}
		}
	}

#if MT32EMU_MONITOR_SYSEX > 0
	Bit8u *rset = mt32ram.system.chanAssign;
	printDebug(" Part assign:     1=%02d 2=%02d 3=%02d 4=%02d 5=%02d 6=%02d 7=%02d 8=%02d Rhythm=%02d", rset[0], rset[1], rset[2], rset[3], rset[4], rset[5], rset[6], rset[7], rset[8]);
#endif
}